

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_13075bd::PostprocFiltersTestLarge_MD5Match_Test::
~PostprocFiltersTestLarge_MD5Match_Test(PostprocFiltersTestLarge_MD5Match_Test *this)

{
  PostprocFiltersTest::~PostprocFiltersTest((PostprocFiltersTest *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(PostprocFiltersTestLarge, MD5Match) { DoTest(); }